

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_create_object_reference_should_create_an_object_reference(void)

{
  long lVar1;
  cJSON *object;
  cJSON *item;
  cJSON *item_00;
  long in_FS_OFFSET;
  char key [7];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  object = cJSON_CreateObject();
  item = cJSON_CreateNumber(42.0);
  builtin_strncpy(key,"number",7);
  if ((item == (cJSON *)0x0) || ((char)item->type != '\b')) {
    UnityFail(" Expected TRUE Was FALSE",0x1f8);
  }
  if ((object == (cJSON *)0x0) || ((char)object->type != '@')) {
    UnityFail(" Expected TRUE Was FALSE",0x1f9);
  }
  cJSON_AddItemToObjectCS(object,key,item);
  item_00 = cJSON_CreateObjectReference(item);
  if (item_00->child != item) {
    UnityFail(" Expected TRUE Was FALSE",0x1fd);
  }
  UnityAssertEqualNumber(0x140,(long)item_00->type,(char *)0x0,0x1fe,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(object);
  cJSON_Delete(item_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_create_object_reference_should_create_an_object_reference(void) {
    cJSON *number_reference = NULL;
    cJSON *number_object = cJSON_CreateObject();
    cJSON *number = cJSON_CreateNumber(42);
    const char key[] = "number";

    TEST_ASSERT_TRUE(cJSON_IsNumber(number));
    TEST_ASSERT_TRUE(cJSON_IsObject(number_object));
    cJSON_AddItemToObjectCS(number_object, key, number);

    number_reference = cJSON_CreateObjectReference(number);
    TEST_ASSERT_TRUE(number_reference->child == number);
    TEST_ASSERT_EQUAL_INT(cJSON_Object | cJSON_IsReference, number_reference->type);

    cJSON_Delete(number_object);
    cJSON_Delete(number_reference);
}